

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  TokenList *args_1;
  SyntaxList<slang::syntax::ClassSpecifierSyntax> *args_3;
  SyntaxNode *args_4;
  ConstraintBlockSyntax *args_5;
  ConstraintDeclarationSyntax *pCVar1;
  DeepCloneVisitor visitor;
  DeepCloneVisitor local_49;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *local_48;
  Token local_40;
  
  local_48 = deepClone<slang::syntax::AttributeInstanceSyntax>
                       ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                        (BumpAllocator *)__child_stack);
  args_1 = deepClone((TokenList *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x88),(BumpAllocator *)__child_stack);
  args_3 = deepClone<slang::syntax::ClassSpecifierSyntax>
                     ((SyntaxList<slang::syntax::ClassSpecifierSyntax> *)(__fn + 0x98),
                      (BumpAllocator *)__child_stack);
  args_4 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0xd0),&local_49,(BumpAllocator *)__child_stack);
  args_5 = (ConstraintBlockSyntax *)
           detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0xd8),&local_49,(BumpAllocator *)__child_stack);
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::ConstraintDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::TokenList&,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::ClassSpecifierSyntax>&,slang::syntax::NameSyntax&,slang::syntax::ConstraintBlockSyntax&>
                     ((BumpAllocator *)__child_stack,local_48,args_1,&local_40,args_3,
                      (NameSyntax *)args_4,args_5);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const ConstraintDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ConstraintDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        *deepClone(node.qualifiers, alloc),
        node.keyword.deepClone(alloc),
        *deepClone(node.specifiers, alloc),
        *deepClone<NameSyntax>(*node.name, alloc),
        *deepClone<ConstraintBlockSyntax>(*node.block, alloc)
    );
}